

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterThunkEmitter.cpp
# Opt level: O0

void InterpreterThunkEmitter::FillBuffer
               (ThreadContextInfo *threadContext,bool asmJsThunk,intptr_t finalAddr,
               size_t bufferSize,BYTE *buffer,PRUNTIME_FUNCTION *pdataTableStart,
               intptr_t *epilogEndAddr,DWORD *thunkCount)

{
  code *pcVar1;
  bool bVar2;
  DWORD size;
  uint uVar3;
  uint uVar4;
  int iVar5;
  DWORD DVar6;
  DWORD DVar7;
  BYTE *pdataBuffer;
  long lVar8;
  long epilogStart_00;
  undefined4 *puVar9;
  BYTE *src;
  BYTE *pdata;
  DWORD functionSize;
  BYTE *epilogEnd;
  int offset;
  DWORD callSize;
  intptr_t finalEpilogStart;
  intptr_t finalPdataStart;
  BYTE *epilogStart;
  BYTE *pdataStart;
  BYTE *currentBuffer;
  intptr_t interpreterThunk;
  BYTE *header;
  BYTE *epilog;
  DWORD local_110;
  DWORD epilogSize;
  DWORD thunks;
  DWORD bytesWritten;
  DWORD bytesRemaining;
  DWORD pdataSize;
  PrologEncoder prologEncoder;
  PRUNTIME_FUNCTION *pdataTableStart_local;
  BYTE *buffer_local;
  size_t bufferSize_local;
  intptr_t finalAddr_local;
  bool asmJsThunk_local;
  ThreadContextInfo *threadContext_local;
  
  prologEncoder._192_8_ = pdataTableStart;
  PrologEncoder::PrologEncoder((PrologEncoder *)&bytesRemaining);
  PrologEncoder::EncodeSmallProlog((PrologEncoder *)&bytesRemaining,'<',0);
  size = PrologEncoder::SizeOfPData((PrologEncoder *)&bytesRemaining);
  local_110 = 0;
  if (asmJsThunk) {
    currentBuffer =
         (BYTE *)ShiftAddr<void(Js::AsmJsCallStackLayout*)>
                           (threadContext,Js::InterpreterStackFrame::InterpreterAsmThunk);
  }
  else {
    currentBuffer =
         (BYTE *)ShiftAddr<void*(Js::JavascriptCallStackLayout*)>
                           (threadContext,Js::InterpreterStackFrame::InterpreterThunk);
  }
  uVar3 = Math::Align<unsigned_int>(size,0x10);
  pdataBuffer = buffer + (0x1000 - uVar3);
  uVar3 = Math::Align<unsigned_int>(2,0x10);
  uVar4 = Math::Align<unsigned_int>(size,0x10);
  lVar8 = finalAddr + (ulong)(0x1000 - uVar4);
  uVar4 = Math::Align<unsigned_int>(2,0x10);
  epilogStart_00 = lVar8 - (ulong)uVar4;
  js_memcpy_s(buffer,0x1000,(anonymous_namespace)::InterpreterThunk,0x48);
  EncodeInterpreterThunk(buffer,finalAddr,epilogStart_00,2,(intptr_t)currentBuffer);
  pdataStart = buffer + 0x48;
  thunks = 0xfb8;
  do {
    iVar5 = (int)((long)pdataBuffer - (ulong)uVar3);
    if ((BYTE *)(((long)pdataBuffer - (ulong)uVar3) - 8) <= pdataStart) {
      DVar6 = FillDebugBreak(pdataStart,iVar5 - (int)pdataStart);
      DVar7 = CopyWithAlignment(pdataStart + DVar6,thunks - DVar6,
                                (BYTE *)&(anonymous_namespace)::Epilog,2,0x10);
      uVar3 = (thunks - DVar6) - DVar7;
      if (pdataBuffer != pdataStart + DVar6 + DVar7) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InterpreterThunkEmitter.cpp"
                           ,0x237,"(pdataStart == currentBuffer)","pdataStart == currentBuffer");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      if (uVar3 < size) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InterpreterThunkEmitter.cpp"
                           ,0x239,"(bytesRemaining >= pdataSize)","bytesRemaining >= pdataSize");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      src = PrologEncoder::Finalize
                      ((PrologEncoder *)&bytesRemaining,buffer,(iVar5 + 2) - (int)buffer,pdataBuffer
                      );
      CopyWithAlignment(pdataBuffer,uVar3,src,size,0x10);
      *(long *)prologEncoder._192_8_ = lVar8;
      *epilogEndAddr = epilogStart_00;
      *thunkCount = local_110;
      return;
    }
    js_memcpy_s(pdataStart,(ulong)thunks,&(anonymous_namespace)::Call,8);
    iVar5 = iVar5 - ((int)pdataStart + 7);
    if (iVar5 < 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InterpreterThunkEmitter.cpp"
                         ,0x221,"(offset >= 0)","offset >= 0");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    Emit<int>(pdataStart,3,iVar5);
    pdataStart = pdataStart + 8;
    thunks = thunks - 8;
    local_110 = local_110 + 1;
  } while( true );
}

Assistant:

void InterpreterThunkEmitter::FillBuffer(
    _In_ ThreadContextInfo * threadContext,
    _In_ bool asmJsThunk,
    _In_ intptr_t finalAddr,
    _In_ size_t bufferSize,
    _Out_writes_bytes_all_(BlockSize) BYTE* buffer,
#if PDATA_ENABLED
    _Out_ PRUNTIME_FUNCTION * pdataTableStart,
    _Out_ intptr_t * epilogEndAddr,
#endif
    _Out_ DWORD * thunkCount
    )
{
#ifdef _M_X64
    PrologEncoder prologEncoder;
    prologEncoder.EncodeSmallProlog(PrologSize, StackAllocSize);
    DWORD pdataSize = prologEncoder.SizeOfPData();
#elif defined(_M_ARM32_OR_ARM64)
    DWORD pdataSize = sizeof(RUNTIME_FUNCTION);
#else
    DWORD pdataSize = 0;
#endif
    DWORD bytesRemaining = BlockSize;
    DWORD bytesWritten = 0;
    DWORD thunks = 0;
    DWORD epilogSize = sizeof(Epilog);
    const BYTE *epilog = Epilog;
    const BYTE *header = InterpreterThunk;

    intptr_t interpreterThunk;

    // the static interpreter thunk invoked by the dynamic emitted thunk
#ifdef ASMJS_PLAT
    if (asmJsThunk)
    {
        interpreterThunk = ShiftAddr(threadContext, &Js::InterpreterStackFrame::InterpreterAsmThunk);
    }
    else
#endif
    {
        interpreterThunk = ShiftAddr(threadContext, &Js::InterpreterStackFrame::InterpreterThunk);
    }


    BYTE * currentBuffer = buffer;
    // Ensure there is space for PDATA at the end
    BYTE* pdataStart = currentBuffer + (BlockSize - Math::Align(pdataSize, EMIT_BUFFER_ALIGNMENT));
    BYTE* epilogStart = pdataStart - Math::Align(epilogSize, EMIT_BUFFER_ALIGNMENT);

    // Ensure there is space for PDATA at the end
    intptr_t finalPdataStart = finalAddr + (BlockSize - Math::Align(pdataSize, EMIT_BUFFER_ALIGNMENT));
    intptr_t finalEpilogStart = finalPdataStart - Math::Align(epilogSize, EMIT_BUFFER_ALIGNMENT);

    // Copy the thunk buffer and modify it.
    js_memcpy_s(currentBuffer, bytesRemaining, header, HeaderSize);
    EncodeInterpreterThunk(currentBuffer, finalAddr, finalEpilogStart, epilogSize, interpreterThunk);
    currentBuffer += HeaderSize;
    bytesRemaining -= HeaderSize;

    // Copy call buffer
    DWORD callSize = sizeof(Call);
    while (currentBuffer < epilogStart - callSize)
    {
        js_memcpy_s(currentBuffer, bytesRemaining, Call, callSize);
#if _M_ARM
        int offset = (epilogStart - (currentBuffer + JmpOffset));
        Assert(offset >= 0);
        DWORD encodedOffset = EncoderMD::BranchOffset_T2_24(offset);
        DWORD encodedBranch = /*opcode=*/ 0x9000F000 | encodedOffset;
        Emit(currentBuffer, JmpOffset, encodedBranch);
#elif _M_ARM64
        int64 offset = (epilogStart - (currentBuffer + JmpOffset));
        Assert(offset >= 0);
        DWORD encodedOffset = EncoderMD::BranchOffset_26(offset);
        DWORD encodedBranch = /*opcode=*/ 0x14000000 | encodedOffset;
        Emit(currentBuffer, JmpOffset, encodedBranch);
#else
        // jump requires an offset from the end of the jump instruction.
        int offset = (int)(epilogStart - (currentBuffer + JmpOffset + sizeof(int)));
        Assert(offset >= 0);
        Emit(currentBuffer, JmpOffset, offset);
#endif
        currentBuffer += callSize;
        bytesRemaining -= callSize;
        thunks++;
    }

    // Fill any gap till start of epilog
    bytesWritten = FillDebugBreak(currentBuffer, (DWORD)(epilogStart - currentBuffer));
    bytesRemaining -= bytesWritten;
    currentBuffer += bytesWritten;

    // Copy epilog
    bytesWritten = CopyWithAlignment(currentBuffer, bytesRemaining, epilog, epilogSize, EMIT_BUFFER_ALIGNMENT);
    currentBuffer += bytesWritten;
    bytesRemaining -= bytesWritten;

    // Generate and register PDATA
#if PDATA_ENABLED
    BYTE* epilogEnd = epilogStart + epilogSize;
    DWORD functionSize = (DWORD)(epilogEnd - buffer);
    Assert(pdataStart == currentBuffer);
#ifdef _M_X64
    Assert(bytesRemaining >= pdataSize);
    BYTE* pdata = prologEncoder.Finalize(buffer, functionSize, pdataStart);
    bytesWritten = CopyWithAlignment(pdataStart, bytesRemaining, pdata, pdataSize, EMIT_BUFFER_ALIGNMENT);
#elif defined(_M_ARM32_OR_ARM64)
    RUNTIME_FUNCTION pdata;
    GeneratePdata(buffer, functionSize, &pdata);
    bytesWritten = CopyWithAlignment(pdataStart, bytesRemaining, (const BYTE*)&pdata, pdataSize, EMIT_BUFFER_ALIGNMENT);
#endif
    *pdataTableStart = (PRUNTIME_FUNCTION)finalPdataStart;
    *epilogEndAddr = finalEpilogStart;
#endif
    *thunkCount = thunks;
}